

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O2

FT_Error FT_Bitmap_Blend(FT_Library library,FT_Bitmap *source_,FT_Vector source_offset_,
                        FT_Bitmap *target,FT_Vector *atarget_offset,FT_Color color)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  undefined4 in_EAX;
  int iVar7;
  uchar *__dest;
  ulong uVar8;
  uchar *__n;
  FT_Memory pFVar9;
  FT_Memory pFVar10;
  uchar *puVar11;
  int *piVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uchar *puVar19;
  FT_Library library_00;
  FT_Bitmap *target_00;
  FT_Memory pFVar20;
  FT_Memory pFVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  FT_Error error;
  undefined8 local_e8;
  uint local_dc;
  uchar *local_d8;
  undefined8 local_d0;
  uchar *local_c8;
  ulong local_c0;
  FT_Memory local_b8;
  FT_Memory local_b0;
  FT_Memory local_a8;
  undefined8 local_a0;
  FT_Library local_98;
  ulong local_90;
  FT_Vector *local_88;
  FT_Memory local_80;
  uint *local_78;
  int *local_70;
  int local_64;
  ulong local_60;
  FT_Bitmap source_bitmap;
  
  error = 0;
  auVar24._0_4_ = -(uint)(library == (FT_Library)0x0);
  auVar24._4_4_ = -(uint)(target == (FT_Bitmap *)0x0);
  auVar24._8_4_ = -(uint)(source_ == (FT_Bitmap *)0x0);
  auVar24._12_4_ = -(uint)(atarget_offset == (FT_Vector *)0x0);
  iVar7 = movmskps(in_EAX,auVar24);
  if (iVar7 != 0) {
    return 6;
  }
  local_70 = &source_->pitch;
  local_b0 = library->memory;
  bVar1 = target->pixel_mode;
  local_dc = (uint)bVar1;
  if (bVar1 == 0) {
    if (source_->pixel_mode == '\0') {
      return 0;
    }
  }
  else {
    if (local_dc != 7) {
      return 6;
    }
    if (target->buffer == (uchar *)0x0) {
      return 6;
    }
    if (source_->pixel_mode == '\0') {
      return 0;
    }
    if ((target->pitch ^ *local_70) < 0) {
      return 6;
    }
  }
  local_a0 = &source_->pixel_mode;
  local_78 = &source_->width;
  if (*local_78 == 0) {
    return 0;
  }
  if (source_->rows == 0) {
    return 0;
  }
  uVar8 = source_offset_.y & 0xffffffffffffffc0;
  local_60 = (ulong)(source_->rows << 6);
  if ((long)uVar8 < (long)(local_60 + 0x8000000000000040)) {
    return 6;
  }
  local_a8 = (FT_Memory)(source_offset_.x & 0xffffffffffffffc0);
  uVar18 = (ulong)(*local_78 << 6);
  if ((long)(0x7fffffffffffffbf - uVar18) < (long)local_a8) {
    return 6;
  }
  uVar4 = target->width;
  local_d0 = CONCAT44(local_d0._4_4_,uVar4);
  if ((uVar4 == 0) || (target->rows == 0)) {
    local_d8 = (uchar *)0x8000000000000000;
    uVar17 = 0x8000000000000000;
    local_b8 = (FT_Memory)0x7fffffffffffffff;
    local_e8 = 0x7fffffffffffffff;
  }
  else {
    uVar17 = atarget_offset->y & 0xffffffffffffffc0;
    local_e8 = (ulong)(target->rows << 6);
    if ((long)uVar17 < (long)(local_e8 + 0x8000000000000000)) {
      return 6;
    }
    local_b8 = (FT_Memory)(atarget_offset->x & 0xffffffffffffffc0);
    if ((long)((ulong)(uVar4 << 6) ^ 0x7fffffffffffffff) < (long)local_b8) {
      return 6;
    }
    local_e8 = uVar17 - local_e8;
    local_d8 = (uchar *)((long)&local_b8->user + (ulong)(uVar4 << 6));
    local_c0 = uVar17;
  }
  local_60 = uVar8 - local_60;
  puVar11 = (uchar *)((long)&local_a8->user + uVar18);
  local_80 = local_b8;
  if ((long)local_a8 < (long)local_b8) {
    local_80 = local_a8;
  }
  local_90 = local_e8;
  if ((long)local_60 < (long)local_e8) {
    local_90 = local_60;
  }
  if ((long)puVar11 <= (long)local_d8) {
    puVar11 = local_d8;
  }
  if ((long)uVar17 < (long)uVar8) {
    uVar17 = uVar8;
  }
  uVar8 = (ulong)((long)puVar11 - (long)local_80) >> 6;
  uVar14 = (uint)uVar8;
  if (uVar14 == 0) {
    return 0;
  }
  uVar17 = uVar17 - local_90;
  uVar15 = (uint)(uVar17 >> 6);
  if (uVar15 == 0) {
    return 0;
  }
  uVar18 = local_e8;
  if ((uVar4 != 0) && (target->rows != 0)) {
    local_b8 = (FT_Memory)((long)local_b8 - (long)local_80);
    uVar18 = local_e8 - local_90;
  }
  local_98 = library;
  local_88 = atarget_offset;
  if (bVar1 == 0) {
    target->width = uVar14;
    target->rows = uVar15;
    target->pixel_mode = '\a';
    iVar7 = uVar14 * 4;
    target->pitch = iVar7;
    target->num_grays = 0x100;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)iVar7),0) <
        (long)(int)uVar15) {
      return 6;
    }
    puVar11 = (uchar *)ft_mem_alloc(local_b0,(long)(int)(iVar7 * uVar15),&error);
    target->buffer = puVar11;
    if (error != 0) {
      return error;
    }
  }
  else if ((uVar4 != uVar14) || (target->rows != uVar15)) {
    uVar4 = target->pitch;
    uVar5 = -uVar4;
    if (0 < (int)uVar4) {
      uVar5 = uVar4;
    }
    iVar7 = uVar14 * 4;
    local_d0 = (ulong)iVar7;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_d0),0) <
        (long)(int)uVar15) {
      return 6;
    }
    local_e8 = uVar8;
    local_c0 = uVar17;
    local_c8 = (uchar *)ft_mem_alloc(local_b0,(long)(int)(iVar7 * uVar15),&error);
    if (error != 0) {
      return error;
    }
    local_64 = iVar7;
    if (-1 < target->pitch) {
      puVar11 = target->buffer;
      __dest = local_c8 +
               ((long)local_b8 >> 4 & 0xfffffffffffffffcU) +
               ((uVar17 >> 6 & 0xffffffff) - (((long)uVar18 >> 6) + (ulong)target->rows)) * local_d0
      ;
      puVar19 = puVar11 + (int)(target->rows * uVar5);
      __n = (uchar *)(ulong)uVar5;
      local_d8 = __n;
      for (; puVar11 < puVar19; puVar11 = puVar11 + (long)__n) {
        memcpy(__dest,puVar11,(size_t)__n);
        __dest = __dest + local_d0;
      }
    }
    ft_mem_free(local_b0,target->buffer);
    target->width = (uint)local_e8;
    target->rows = uVar15;
    iVar7 = -local_64;
    if (-1 < target->pitch) {
      iVar7 = local_64;
    }
    target->pitch = iVar7;
    target->buffer = local_c8;
    uVar17 = local_c0;
  }
  library_00 = local_98;
  bVar22 = *local_a0 == '\x02';
  local_c0 = uVar17;
  if (bVar22) {
    piVar12 = local_70;
    puVar13 = local_78;
    target_00 = source_;
  }
  else {
    target_00 = &source_bitmap;
    source_bitmap.buffer = (uchar *)0x0;
    source_bitmap.num_grays = 0;
    source_bitmap.pixel_mode = '\0';
    source_bitmap.palette_mode = '\0';
    source_bitmap._28_4_ = 0;
    source_bitmap.rows = 0;
    source_bitmap.width = 0;
    source_bitmap.pitch = 0;
    source_bitmap._12_4_ = 0;
    source_bitmap.palette = (void *)0x0;
    error = FT_Bitmap_Convert(local_98,source_,target_00,1);
    bVar23 = true;
    bVar6 = true;
    if (error != 0) goto LAB_0022d562;
    piVar12 = &source_bitmap.pitch;
    puVar13 = &source_bitmap.width;
  }
  local_c8 = (uchar *)CONCAT71(local_c8._1_7_,bVar22);
  if (-1 < (long)target->pitch) {
    local_d8 = (uchar *)CONCAT44(local_d8._4_4_,(uint)color >> 0x18);
    local_b8 = (FT_Memory)
               ((long)&((FT_Memory)target_00->buffer)->user +
               (long)*piVar12 * (long)(int)target_00->rows);
    local_a0 = (uchar *)(CONCAT44(local_a0._4_4_,color) & 0xffffffff000000ff);
    local_e8 = CONCAT44(local_e8._4_4_,(uint)color >> 8) & 0xffffffff000000ff;
    local_d0 = CONCAT44(local_d0._4_4_,(uint)color >> 0x10) & 0xffffffff000000ff;
    pFVar10 = (FT_Memory)
              (target->buffer +
              ((long)local_a8 - (long)local_80 >> 4 & 0xfffffffffffffffcU) +
              ((ulong)target->rows - ((ulong)target_00->rows + ((long)(local_60 - local_90) >> 6)))
              * (long)target->pitch);
    pFVar21 = (FT_Memory)target_00->buffer;
    while (pFVar20 = pFVar21, pFVar9 = pFVar10, local_78 = puVar13, local_70 = piVar12,
          pFVar20 < local_b8) {
      uVar4 = *puVar13;
      pFVar10 = pFVar9;
      for (pFVar21 = pFVar20; pFVar21 < (FT_Memory)((long)&pFVar20->user + (ulong)uVar4);
          pFVar21 = (FT_Memory)((long)&pFVar21->user + 1)) {
        uVar8 = (ulong)((uint)*(byte *)&pFVar21->user * ((uint)color >> 0x18)) / 0xff;
        iVar7 = (int)uVar8;
        iVar16 = 0xff - iVar7;
        bVar1 = *(byte *)((long)&pFVar10->user + 1);
        bVar2 = *(byte *)((long)&pFVar10->user + 2);
        bVar3 = *(byte *)((long)&pFVar10->user + 3);
        *(char *)&pFVar10->user =
             (char)(((uint)*(byte *)&pFVar10->user * iVar16 & 0xffff) / 0xff) +
             (char)((ulong)(uint)(iVar7 * (int)local_a0) / 0xff);
        *(char *)((long)&pFVar10->user + 1) =
             (char)(((uint)bVar1 * iVar16 & 0xffff) / 0xff) +
             (char)((ulong)(uint)(iVar7 * (int)local_e8) / 0xff);
        *(char *)((long)&pFVar10->user + 2) =
             (char)(((uint)bVar2 * iVar16 & 0xffff) / 0xff) +
             (char)((ulong)(uint)(iVar7 * (int)local_d0) / 0xff);
        *(char *)((long)&pFVar10->user + 3) =
             (char)(((uint)bVar3 * iVar16 & 0xffff) / 0xff) + (char)uVar8;
        pFVar10 = (FT_Memory)((long)&pFVar10->user + 4);
      }
      pFVar10 = (FT_Memory)((long)&pFVar9->user + (long)target->pitch);
      local_b0 = pFVar20;
      local_a8 = pFVar9;
      pFVar21 = (FT_Memory)((long)&pFVar20->user + (long)*piVar12);
    }
  }
  local_88->x = (FT_Pos)local_80;
  local_88->y = ((uint)local_c0 & 0xffffffc0) + local_90;
  bVar23 = error != 0;
  library_00 = local_98;
  bVar6 = bVar22;
LAB_0022d562:
  if (((char)local_dc == '\0') && (bVar23)) {
    FT_Bitmap_Done(library_00,target);
  }
  if (!bVar6) {
    FT_Bitmap_Done(library_00,&source_bitmap);
  }
  return error;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Blend( FT_Library        library,
                   const FT_Bitmap*  source_,
                   const FT_Vector   source_offset_,
                   FT_Bitmap*        target,
                   FT_Vector        *atarget_offset,
                   FT_Color          color )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    FT_Bitmap         source_bitmap;
    const FT_Bitmap*  source;

    FT_Vector  source_offset;
    FT_Vector  target_offset;

    FT_Bool  free_source_bitmap          = 0;
    FT_Bool  free_target_bitmap_on_error = 0;

    FT_Pos  source_llx, source_lly, source_urx, source_ury;
    FT_Pos  target_llx, target_lly, target_urx, target_ury;
    FT_Pos  final_llx, final_lly, final_urx, final_ury;

    unsigned int  final_rows, final_width;
    long          x, y;


    if ( !library || !target || !source_ || !atarget_offset )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    if ( !( target->pixel_mode == FT_PIXEL_MODE_NONE     ||
            ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
              target->buffer                           ) ) )
      return FT_THROW( Invalid_Argument );

    if ( source_->pixel_mode == FT_PIXEL_MODE_NONE )
      return FT_Err_Ok;               /* nothing to do */

    /* pitches must have the same sign */
    if ( target->pixel_mode == FT_PIXEL_MODE_BGRA &&
         ( source_->pitch ^ target->pitch ) < 0   )
      return FT_THROW( Invalid_Argument );

    if ( !( source_->width && source_->rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* assure integer pixel offsets */
    source_offset.x = FT_PIX_FLOOR( source_offset_.x );
    source_offset.y = FT_PIX_FLOOR( source_offset_.y );
    target_offset.x = FT_PIX_FLOOR( atarget_offset->x );
    target_offset.y = FT_PIX_FLOOR( atarget_offset->y );

    /* get source bitmap dimensions */
    source_llx = source_offset.x;
    if ( FT_LONG_MIN + (FT_Pos)( source_->rows << 6 ) + 64 > source_offset.y )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: y coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_lly = source_offset.y - ( source_->rows << 6 );

    if ( FT_LONG_MAX - (FT_Pos)( source_->width << 6 ) - 64 < source_llx )
    {
      FT_TRACE5((
        "FT_Bitmap_Blend: x coordinate overflow in source bitmap\n" ));
      return FT_THROW( Invalid_Argument );
    }
    source_urx = source_llx + ( source_->width << 6 );
    source_ury = source_offset.y;

    /* get target bitmap dimensions */
    if ( target->width && target->rows )
    {
      target_llx = target_offset.x;
      if ( FT_LONG_MIN + (FT_Pos)( target->rows << 6 ) > target_offset.y )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: y coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_lly = target_offset.y - ( target->rows << 6 );

      if ( FT_LONG_MAX - (FT_Pos)( target->width << 6 ) < target_llx )
      {
        FT_TRACE5((
          "FT_Bitmap_Blend: x coordinate overflow in target bitmap\n" ));
        return FT_THROW( Invalid_Argument );
      }
      target_urx = target_llx + ( target->width << 6 );
      target_ury = target_offset.y;
    }
    else
    {
      target_llx = FT_LONG_MAX;
      target_lly = FT_LONG_MAX;
      target_urx = FT_LONG_MIN;
      target_ury = FT_LONG_MIN;
    }

    /* compute final bitmap dimensions */
    final_llx = FT_MIN( source_llx, target_llx );
    final_lly = FT_MIN( source_lly, target_lly );
    final_urx = FT_MAX( source_urx, target_urx );
    final_ury = FT_MAX( source_ury, target_ury );

    final_width = ( final_urx - final_llx ) >> 6;
    final_rows  = ( final_ury - final_lly ) >> 6;

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Bitmap_Blend:\n" ));
    FT_TRACE5(( "  source bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
      source_llx / 64, source_lly / 64,
      source_urx / 64, source_ury / 64,
      source_->width, source_->rows ));

    if ( target->width && target->rows )
      FT_TRACE5(( "  target bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        target_llx / 64, target_lly / 64,
        target_urx / 64, target_ury / 64,
        target->width, target->rows ));
    else
      FT_TRACE5(( "  target bitmap: empty\n" ));

    if ( final_width && final_rows )
      FT_TRACE5(( "  final bitmap: (%ld, %ld) -- (%ld, %ld); %d x %d\n",
        final_llx / 64, final_lly / 64,
        final_urx / 64, final_ury / 64,
        final_width, final_rows ));
    else
      FT_TRACE5(( "  final bitmap: empty\n" ));
#endif /* FT_DEBUG_LEVEL_TRACE */

    if ( !( final_width && final_rows ) )
      return FT_Err_Ok;               /* nothing to do */

    /* for blending, set offset vector of final bitmap */
    /* temporarily to (0,0)                            */
    source_llx -= final_llx;
    source_lly -= final_lly;

    if ( target->width && target->rows )
    {
      target_llx -= final_llx;
      target_lly -= final_lly;
    }

    /* set up target bitmap */
    if ( target->pixel_mode == FT_PIXEL_MODE_NONE )
    {
      /* create new empty bitmap */
      target->width      = final_width;
      target->rows       = final_rows;
      target->pixel_mode = FT_PIXEL_MODE_BGRA;
      target->pitch      = (int)final_width * 4;
      target->num_grays  = 256;

      if ( FT_LONG_MAX / target->pitch < (int)target->rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      if ( FT_ALLOC( target->buffer, target->pitch * (int)target->rows ) )
        return error;

      free_target_bitmap_on_error = 1;
    }
    else if ( target->width != final_width ||
              target->rows  != final_rows  )
    {
      /* adjust old bitmap to enlarged size */
      int  pitch, new_pitch;

      unsigned char*  buffer = NULL;


      pitch = target->pitch;

      if ( pitch < 0 )
        pitch = -pitch;

      new_pitch = (int)final_width * 4;

      if ( FT_LONG_MAX / new_pitch < (int)final_rows )
      {
        FT_TRACE5(( "FT_Blend_Bitmap: target bitmap too large (%d x %d)\n",
                     final_width, final_rows ));
        return FT_THROW( Invalid_Argument );
      }

      /* TODO: provide an in-buffer solution for large bitmaps */
      /*       to avoid allocation of a new buffer             */
      if ( FT_ALLOC( buffer, new_pitch * (int)final_rows ) )
        goto Error;

      /* copy data to new buffer */
      x = target_llx >> 6;
      y = target_lly >> 6;

      /* the bitmap flow is from top to bottom, */
      /* but y is measured from bottom to top   */
      if ( target->pitch < 0 )
      {
        /* XXX */
      }
      else
      {
        unsigned char*  p =
          target->buffer;
        unsigned char*  q =
          buffer +
          ( final_rows - y - target->rows ) * new_pitch +
          x * 4;
        unsigned char*  limit_p =
          p + pitch * (int)target->rows;


        while ( p < limit_p )
        {
          FT_MEM_COPY( q, p, pitch );

          p += pitch;
          q += new_pitch;
        }
      }

      FT_FREE( target->buffer );

      target->width = final_width;
      target->rows  = final_rows;

      if ( target->pitch < 0 )
        target->pitch = -new_pitch;
      else
        target->pitch = new_pitch;

      target->buffer = buffer;
    }

    /* adjust source bitmap if necessary */
    if ( source_->pixel_mode != FT_PIXEL_MODE_GRAY )
    {
      FT_Bitmap_Init( &source_bitmap );
      error = FT_Bitmap_Convert( library, source_, &source_bitmap, 1 );
      if ( error )
        goto Error;

      source             = &source_bitmap;
      free_source_bitmap = 1;
    }
    else
      source = source_;

    /* do blending; the code below returns pre-multiplied channels, */
    /* similar to what FreeType gets from `CBDT' tables             */
    x = source_llx >> 6;
    y = source_lly >> 6;

    /* the bitmap flow is from top to bottom, */
    /* but y is measured from bottom to top   */
    if ( target->pitch < 0 )
    {
      /* XXX */
    }
    else
    {
      unsigned char*  p =
        source->buffer;
      unsigned char*  q =
        target->buffer +
        ( target->rows - y - source->rows ) * target->pitch +
        x * 4;
      unsigned char*  limit_p =
        p + source->pitch * (int)source->rows;


      while ( p < limit_p )
      {
        unsigned char*  r       = p;
        unsigned char*  s       = q;
        unsigned char*  limit_r = r + source->width;


        while ( r < limit_r )
        {
          int  aa = *r++;
          int  fa = color.alpha * aa / 255;

          int  fb = color.blue * fa / 255;
          int  fg = color.green * fa / 255;
          int  fr = color.red * fa / 255;

          int  ba2 = 255 - fa;

          int  bb = s[0];
          int  bg = s[1];
          int  br = s[2];
          int  ba = s[3];


          *s++ = (unsigned char)( bb * ba2 / 255 + fb );
          *s++ = (unsigned char)( bg * ba2 / 255 + fg );
          *s++ = (unsigned char)( br * ba2 / 255 + fr );
          *s++ = (unsigned char)( ba * ba2 / 255 + fa );
        }

        p += source->pitch;
        q += target->pitch;
      }
    }

    atarget_offset->x = final_llx;
    atarget_offset->y = final_lly + ( final_rows << 6 );

  Error:
    if ( error && free_target_bitmap_on_error )
      FT_Bitmap_Done( library, target );

    if ( free_source_bitmap )
      FT_Bitmap_Done( library, &source_bitmap );

    return error;
  }